

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_growstack(lua_State *L,int n,int raiseerror)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)((ulong)((long)(L->stack_last).p - (L->stack).offset) >> 4);
  if (iVar2 < 0xf4241) {
    if ((n < 1000000) &&
       (iVar1 = (int)((ulong)((long)(L->top).p - (L->stack).offset) >> 4) + n, iVar1 < 0xf4241)) {
      iVar2 = (iVar2 >> 1) + iVar2;
      if (999999 < iVar2) {
        iVar2 = 1000000;
      }
      if (iVar2 <= iVar1) {
        iVar2 = iVar1;
      }
      iVar2 = luaD_reallocstack(L,iVar2,raiseerror);
      return iVar2;
    }
    luaD_growstack_cold_1();
  }
  else if (raiseerror != 0) {
    luaD_errerr(L);
  }
  return 0;
}

Assistant:

int luaD_growstack (lua_State *L, int n, int raiseerror) {
  int size = stacksize(L);
  if (l_unlikely(size > MAXSTACK)) {
    /* if stack is larger than maximum, thread is already using the
       extra space reserved for errors, that is, thread is handling
       a stack error; cannot grow further than that. */
    lua_assert(stacksize(L) == ERRORSTACKSIZE);
    if (raiseerror)
      luaD_errerr(L);  /* error inside message handler */
    return 0;  /* if not 'raiseerror', just signal it */
  }
  else if (n < MAXSTACK) {  /* avoids arithmetic overflows */
    int newsize = size + (size >> 1);  /* tentative new size (size * 1.5) */
    int needed = cast_int(L->top.p - L->stack.p) + n;
    if (newsize > MAXSTACK)  /* cannot cross the limit */
      newsize = MAXSTACK;
    if (newsize < needed)  /* but must respect what was asked for */
      newsize = needed;
    if (l_likely(newsize <= MAXSTACK))
      return luaD_reallocstack(L, newsize, raiseerror);
  }
  /* else stack overflow */
  /* add extra size to be able to handle the error message */
  luaD_reallocstack(L, ERRORSTACKSIZE, raiseerror);
  if (raiseerror)
    luaG_runerror(L, "stack overflow");
  return 0;
}